

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::MultisampleTextureUsageCase::init
          (MultisampleTextureUsageCase *this,EVP_PKEY_CTX *ctx)

{
  GLuint *pGVar1;
  bool bVar2;
  TestLog *pTVar3;
  Context *pCVar4;
  RenderContext *pRVar5;
  ScopedLogSection SVar6;
  bool bVar7;
  int iVar8;
  ContextType CVar9;
  deUint32 dVar10;
  GLSLVersion GVar11;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar12;
  char *__s;
  mapped_type *pmVar13;
  ShaderProgram *pSVar14;
  char *pcVar15;
  pointer __dest;
  long *plVar16;
  TestError *pTVar17;
  NotSupportedError *pNVar18;
  GetNameFunc p_Var19;
  long lVar20;
  bool *pbVar21;
  int iVar22;
  char *pcVar23;
  long lVar24;
  bool *pbVar25;
  bool bVar26;
  GLint maxTextureSize;
  GLint maxSamples;
  ScopedLogSection section;
  ScopedLogSection section_1;
  undefined1 local_2c8 [8];
  undefined1 local_2c0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Base_ptr local_2a8;
  size_t local_2a0;
  undefined1 local_298 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  ShaderProgram *local_270;
  string local_268;
  ScopedLogSection local_248;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  pointer local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [6];
  ios_base local_188 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_170;
  undefined1 local_150 [208];
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ScopedLogSection local_58;
  StringTemplate local_50;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar24 = CONCAT44(extraout_var,iVar8);
  iVar8 = 0x8229;
  if ((((this->m_isColorFormat == false) && (iVar8 = 0x8231, this->m_isSignedFormat == false)) &&
      (iVar8 = 0x8232, this->m_isUnsignedFormat == false)) &&
     (iVar8 = 0x8cac, this->m_isDepthFormat == false)) {
    iVar8 = 0;
  }
  bVar26 = this->m_isArrayType;
  bVar2 = this->m_isDepthFormat;
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(CVar9,(ApiType)0x23);
  if (((!bVar7) && (this->m_isArrayType != false)) &&
     (bVar7 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_texture_storage_multisample_2d_array"), !bVar7)) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_200 = (undefined1  [8])local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,
               "Test requires OES_texture_storage_multisample_2d_array extension","");
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_200);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar12->m_width < 0x100) ||
     (pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar12->m_height < 0x100)) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_220._M_dataplus._M_p._0_4_ = 0x100;
    de::toString<int>((string *)local_80,(int *)&local_220);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   "render target size must be at least ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    plVar16 = (long *)std::__cxx11::string::append(local_298);
    local_2c8 = (undefined1  [8])*plVar16;
    p_Var19 = (GetNameFunc)(plVar16 + 2);
    if (local_2c8 == (undefined1  [8])p_Var19) {
      local_2b8._M_allocated_capacity = *(undefined8 *)p_Var19;
      local_2b8._8_8_ = plVar16[3];
      local_2c8 = (undefined1  [8])(local_2c0 + 8);
    }
    else {
      local_2b8._M_allocated_capacity = *(undefined8 *)p_Var19;
    }
    local_2c0 = (undefined1  [8])plVar16[1];
    *plVar16 = (long)p_Var19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    local_50.m_template._M_dataplus._M_p._0_4_ = 0x100;
    de::toString<int>(&local_268,(int *)&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                   &local_268);
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_200);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar22 = (uint)bVar26 * 2 + 0x9100;
  local_298._0_8_ = (ulong)(uint)local_298._4_4_ << 0x20;
  local_270 = (ShaderProgram *)CONCAT44(local_270._4_4_,iVar22);
  (**(code **)(lVar24 + 0x880))(iVar22,iVar8,0x80a9,1,local_298);
  if ((int)local_298._0_4_ < this->m_numSamples) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_200 = (undefined1  [8])local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Requested sample count is greater than supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_200);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_200 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"Max sample count for ",0x15);
  local_2c8 = (undefined1  [8])glu::getTextureFormatName;
  local_2c0._0_4_ = iVar8;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_2c8,(ostream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,": ",2);
  std::ostream::operator<<((ostringstream *)&local_1f8,local_298._0_4_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffff00000000);
  (**(code **)(lVar24 + 0x868))(0xd33,local_2c8);
  if ((int)local_2c8._0_4_ < 0x100) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_200 = (undefined1  [8])local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Larger GL_MAX_TEXTURE_SIZE is required","");
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_200);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_isArrayType == true) {
    local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffff00000000);
    (**(code **)(lVar24 + 0x868))(0x88ff,local_2c8);
    if ((int)local_2c8._0_4_ < 8) {
      pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])local_1f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"Larger GL_MAX_ARRAY_TEXTURE_LAYERS is required","");
      tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_200);
      __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_200 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"Creating multisample ",0x15);
  pbVar21 = (bool *)0xa03ada;
  pbVar25 = SSBOArrayLengthTests::init::arraysSized + 1;
  if ((ulong)this->m_isDepthFormat == 0) {
    pbVar21 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,pbVar21,(ulong)this->m_isDepthFormat * 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," texture",8);
  bVar26 = this->m_isArrayType != false;
  if (bVar26) {
    pbVar25 = (bool *)0x965cd3;
  }
  lVar20 = 6;
  if (!bVar26) {
    lVar20 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pbVar25,lVar20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  pGVar1 = &this->m_textureID;
  (**(code **)(lVar24 + 0x6f8))(1,pGVar1);
  (**(code **)(lVar24 + 0xb8))((ulong)local_270 & 0xffffffff,this->m_textureID);
  dVar10 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar10,"bind texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x492);
  if (this->m_isArrayType == true) {
    (**(code **)(lVar24 + 0x13a8))(0x9102,this->m_numSamples,iVar8,0x100,0x100,8,0);
  }
  else {
    (**(code **)(lVar24 + 0x1390))(0x9100,this->m_numSamples,iVar8,0x100,0x100,0);
  }
  iVar8 = (uint)bVar2 * 0x20 + 0x8ce0;
  dVar10 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar10,"texstorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x498);
  (**(code **)(lVar24 + 0x6d0))(1,&this->m_fboID);
  (**(code **)(lVar24 + 0x78))(0x8d40,this->m_fboID);
  if (this->m_isArrayType == true) {
    local_200 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Attaching multisample texture array layer ",0x2a);
    std::ostream::operator<<((ostringstream *)&local_1f8,3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," to fbo",7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    (**(code **)(lVar24 + 0x6b8))(0x8d40,iVar8,*pGVar1,0,3);
  }
  else {
    local_200 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Attaching multisample texture to fbo",0x24);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    (**(code **)(lVar24 + 0x6a0))(0x8d40,iVar8,(ulong)local_270 & 0xffffffff,*pGVar1,0);
  }
  dVar10 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar10,"gen fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x4a9);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1f0[0]._M_allocated_capacity._0_4_ = 0x646e6552;
  local_1f0[0]._M_local_buf[4] = 'e';
  local_1f0[0]._M_allocated_capacity._5_2_ = 0x5372;
  local_1f0[0]._M_local_buf[7] = 'h';
  local_1f0[0]._M_local_buf[8] = 'a';
  local_1f0[0]._9_2_ = 0x6564;
  local_1f0[0]._M_local_buf[0xb] = 'r';
  local_1f8 = (pointer)0xc;
  local_1f0[0]._M_local_buf[0xc] = '\0';
  local_298._0_8_ = (pointer)0x21;
  local_2c8 = (undefined1  [8])(local_2c0 + 8);
  local_200 = (undefined1  [8])local_1f0;
  local_2c8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_2c8,(ulong)local_298);
  local_2b8._M_allocated_capacity = local_298._0_8_;
  *(undefined8 *)((long)local_2c8 + 0x10) = 0x75747865742d6f74;
  *(undefined8 *)((long)local_2c8 + 0x18) = 0x6564616873206572;
  *(undefined8 *)local_2c8 = 0x65746172656e6547;
  *(undefined8 *)((long)local_2c8 + 8) = 0x2d7265646e657220;
  *(code *)((long)local_2c8 + 0x20) = (code)0x72;
  local_2c0 = (undefined1  [8])local_298._0_8_;
  *(char *)((long)local_2c8 + local_298._0_8_) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_248,pTVar3,(string *)local_200,(string *)local_2c8)
  ;
  if (local_2c8 != (undefined1  [8])(local_2c0 + 8)) {
    operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,
                    CONCAT17(local_1f0[0]._M_local_buf[7],
                             CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1f0[0]._M_local_buf[4],
                                               (undefined4)local_1f0[0]._M_allocated_capacity))) + 1
                   );
  }
  bVar26 = this->m_isDepthFormat;
  pcVar23 = 
  "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp ${OUTTYPE} fragColor;\nuniform highp float u_writeValue;\nvoid main (void)\n{\n\tfragColor = ${OUTTYPE}(vec4(u_writeValue, 1.0, 1.0, 1.0));\n}\n"
  ;
  if (bVar26 != false) {
    pcVar23 = 
    "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp float u_writeValue;\nvoid main (void)\n{\n\tfragColor = vec4(0.0, 0.0, 0.0, 1.0);\n\tgl_FragDepth = u_writeValue;\n}\n"
    ;
  }
  local_2b8._8_8_ = local_2c0;
  local_2c0 = (undefined1  [8])((ulong)local_2c0 & 0xffffffff00000000);
  local_2b8._M_allocated_capacity = 0;
  local_2a0 = 0;
  local_2a8 = (_Base_ptr)local_2b8._8_8_;
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar11 = glu::getContextTypeGLSLVersion(CVar9);
  __s = glu::getGLSLVersionDeclaration(GVar11);
  local_298._0_8_ = (pointer)0x11;
  local_200 = (undefined1  [8])local_1f0;
  local_200 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_200,(ulong)local_298);
  local_1f0[0]._M_allocated_capacity._0_4_ = (undefined4)local_298._0_8_;
  local_1f0[0]._M_local_buf[4] = SUB81(local_298._0_8_,4);
  local_1f0[0]._M_allocated_capacity._5_2_ = SUB82(local_298._0_8_,5);
  local_1f0[0]._M_local_buf[7] = SUB81(local_298._0_8_,7);
  *(undefined8 *)local_200 = 0x5245565f4c534c47;
  *(undefined8 *)((long)local_200 + 8) = 0x4345445f4e4f4953;
  *(char *)((long)local_200 + 0x10) = 'L';
  local_1f8 = (pointer)local_298._0_8_;
  *(char *)(local_298._0_8_ + (long)local_200) = '\0';
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_2c8,(key_type *)local_200);
  pcVar15 = (char *)pmVar13->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar15,(ulong)__s);
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,
                    CONCAT17(local_1f0[0]._M_local_buf[7],
                             CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1f0[0]._M_local_buf[4],
                                               (undefined4)local_1f0[0]._M_allocated_capacity))) + 1
                   );
  }
  if ((this->m_isColorFormat == false) && (this->m_isDepthFormat != true)) {
    if (this->m_isSignedFormat == true) {
      local_1f0[0]._M_allocated_capacity._0_4_ = 0x5454554f;
      local_1f0[0]._M_local_buf[4] = 'Y';
      local_1f0[0]._M_allocated_capacity._5_2_ = 0x4550;
      local_1f8 = (pointer)0x7;
      local_1f0[0]._M_local_buf[7] = '\0';
      local_200 = (undefined1  [8])local_1f0;
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_2c8,(key_type *)local_200);
      __s = "ivec4";
      std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x97b064);
      goto LAB_004f6ad0;
    }
    if (this->m_isUnsignedFormat == true) {
      local_1f0[0]._M_allocated_capacity._0_4_ = 0x5454554f;
      local_1f0[0]._M_local_buf[4] = 'Y';
      local_1f0[0]._M_allocated_capacity._5_2_ = 0x4550;
      local_1f8 = (pointer)0x7;
      local_1f0[0]._M_local_buf[7] = '\0';
      local_200 = (undefined1  [8])local_1f0;
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_2c8,(key_type *)local_200);
      __s = "uvec4";
      std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x97b093);
      goto LAB_004f6ad0;
    }
  }
  else {
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x5454554f;
    local_1f0[0]._M_local_buf[4] = 'Y';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x4550;
    local_1f8 = (pointer)0x7;
    local_1f0[0]._M_local_buf[7] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    __s = "vec4";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9b8e29);
LAB_004f6ad0:
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,
                      CONCAT17(local_1f0[0]._M_local_buf[7],
                               CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                        CONCAT14(local_1f0[0]._M_local_buf[4],
                                                 (undefined4)local_1f0[0]._M_allocated_capacity))) +
                      1);
    }
  }
  pSVar14 = (ShaderProgram *)operator_new(0xd0);
  pCVar4 = (this->super_TestCase).m_context;
  pRVar5 = pCVar4->m_renderCtx;
  local_150[0x10] = 0;
  local_150._17_8_ = 0;
  local_150._0_8_ = (pointer)0x0;
  local_150[8] = 0;
  local_150._9_7_ = 0;
  memset(local_200,0,0xac);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_268,(_anonymous_namespace_ *)pCVar4,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,__s);
  local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
  local_298._8_8_ = &local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_298 + 8),local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_200 + (local_298._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_298 + 8));
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,pcVar23,pcVar23 + (ulong)bVar26 * 3 + 0xbd);
  tcu::StringTemplate::StringTemplate(&local_50,&local_240);
  tcu::StringTemplate::specialize
            (&local_220,&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2c8);
  local_80._0_4_ = 1;
  local_80._8_8_ = &local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_80 + 8),
             CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_),
             local_220._M_string_length +
             CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_200 + (ulong)(uint)local_80._0_4_ * 0x18),(value_type *)(local_80 + 8));
  glu::ShaderProgram::ShaderProgram(pSVar14,pRVar5,(ProgramSources *)local_200);
  this->m_drawShader = pSVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_) !=
      &local_220.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_),
                    local_220.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._8_8_ != &local_280) {
    operator_delete((void *)local_298._8_8_,local_280._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_150);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_170);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_200 + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_drawShader);
  if ((this->m_drawShader->m_program).m_info.linkOk == false) {
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    local_200 = (undefined1  [8])local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"could not build shader","")
    ;
    tcu::TestError::TestError(pTVar17,(string *)local_200);
    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2c8);
  tcu::TestLog::endSection(local_248.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1f0[0]._M_allocated_capacity._0_4_ = 0x706d6153;
  local_1f0[0]._M_local_buf[4] = 'l';
  local_1f0[0]._M_allocated_capacity._5_2_ = 0x7265;
  local_1f0[0]._M_local_buf[7] = 'S';
  local_1f0[0]._M_local_buf[8] = 'h';
  local_1f0[0]._9_2_ = 0x6461;
  local_1f0[0]._M_local_buf[0xb] = 'e';
  local_1f0[0]._M_local_buf[0xc] = 'r';
  local_1f8 = (pointer)0xd;
  local_1f0[0]._M_local_buf[0xd] = '\0';
  local_2c8 = (undefined1  [8])(local_2c0 + 8);
  local_298._0_8_ = (pointer)0x1f;
  local_200 = (undefined1  [8])local_1f0;
  local_2c8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_2c8,(ulong)local_298);
  local_2b8._M_allocated_capacity = local_298._0_8_;
  *(undefined8 *)((long)local_2c8 + 0xf) = 0x656c706d61732065;
  *(undefined8 *)((long)local_2c8 + 0x17) = 0x7265646168732072;
  *(undefined8 *)local_2c8 = 0x65746172656e6547;
  *(undefined8 *)((long)local_2c8 + 8) = 0x6572757478657420;
  local_2c0 = (undefined1  [8])local_298._0_8_;
  *(char *)((long)local_2c8 + local_298._0_8_) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_58,pTVar3,(string *)local_200,(string *)local_2c8);
  if (local_2c8 != (undefined1  [8])(local_2c0 + 8)) {
    operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,
                    CONCAT17(local_1f0[0]._M_local_buf[7],
                             CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1f0[0]._M_local_buf[4],
                                               (undefined4)local_1f0[0]._M_allocated_capacity))) + 1
                   );
  }
  local_2c0 = (undefined1  [8])((ulong)local_2c0 & 0xffffffff00000000);
  local_2b8._M_allocated_capacity = 0;
  local_2b8._8_8_ = local_2c0;
  local_2a0 = 0;
  local_2a8 = (_Base_ptr)local_2b8._8_8_;
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar11 = glu::getContextTypeGLSLVersion(CVar9);
  pcVar15 = glu::getGLSLVersionDeclaration(GVar11);
  local_298._0_8_ = (pointer)0x11;
  local_200 = (undefined1  [8])local_1f0;
  local_200 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_200,(ulong)local_298);
  local_1f0[0]._M_allocated_capacity._0_4_ = (undefined4)local_298._0_8_;
  local_1f0[0]._M_local_buf[4] = SUB81(local_298._0_8_,4);
  local_1f0[0]._M_allocated_capacity._5_2_ = SUB82(local_298._0_8_,5);
  local_1f0[0]._M_local_buf[7] = SUB81(local_298._0_8_,7);
  *(undefined8 *)local_200 = 0x5245565f4c534c47;
  *(undefined8 *)((long)local_200 + 8) = 0x4345445f4e4f4953;
  *(char *)((long)local_200 + 0x10) = 'L';
  local_1f8 = (pointer)local_298._0_8_;
  *(char *)(local_298._0_8_ + (long)local_200) = '\0';
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_2c8,(key_type *)local_200);
  pcVar23 = (char *)pmVar13->_M_string_length;
  strlen(pcVar15);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar23,(ulong)pcVar15);
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,
                    CONCAT17(local_1f0[0]._M_local_buf[7],
                             CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1f0[0]._M_local_buf[4],
                                               (undefined4)local_1f0[0]._M_allocated_capacity))) + 1
                   );
  }
  if (this->m_isArrayType == true) {
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x43544546;
    local_1f0[0]._M_local_buf[4] = 'H';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x4f50;
    local_1f0[0]._M_local_buf[7] = 'S';
    local_1f8 = (pointer)0x8;
    local_1f0[0]._M_local_buf[8] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x997b6c);
  }
  else {
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x43544546;
    local_1f0[0]._M_local_buf[4] = 'H';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x4f50;
    local_1f0[0]._M_local_buf[7] = 'S';
    local_1f8 = (pointer)0x8;
    local_1f0[0]._M_local_buf[8] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x997b93);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,
                    CONCAT17(local_1f0[0]._M_local_buf[7],
                             CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1f0[0]._M_local_buf[4],
                                               (undefined4)local_1f0[0]._M_allocated_capacity))) + 1
                   );
  }
  if ((this->m_isColorFormat == false) && (this->m_isDepthFormat != true)) {
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x49535045;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x4e4f;
    local_1f8 = (pointer)0x7;
    local_1f0[0]._M_local_buf[7] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x968247);
  }
  else {
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x49535045;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x4e4f;
    local_1f8 = (pointer)0x7;
    local_1f0[0]._M_local_buf[7] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x997bb1);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,
                    CONCAT17(local_1f0[0]._M_local_buf[7],
                             CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1f0[0]._M_local_buf[4],
                                               (undefined4)local_1f0[0]._M_allocated_capacity))) + 1
                   );
  }
  if (this->m_isArrayType == true) {
    CVar9.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar26 = glu::contextSupports(CVar9,(ApiType)0x23);
    if (bVar26) goto LAB_004f714d;
    local_298._0_8_ = (pointer)0x13;
    local_200 = (undefined1  [8])local_1f0;
    local_200 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_200,(ulong)local_298);
    local_1f0[0]._M_allocated_capacity._0_4_ = (undefined4)local_298._0_8_;
    local_1f0[0]._M_local_buf[4] = SUB81(local_298._0_8_,4);
    local_1f0[0]._M_allocated_capacity._5_2_ = SUB82(local_298._0_8_,5);
    local_1f0[0]._M_local_buf[7] = SUB81(local_298._0_8_,7);
    *(undefined8 *)local_200 = 0x4f49534e45545845;
    *(undefined8 *)((long)local_200 + 8) = 0x4d45544154535f4e;
    builtin_strncpy((char *)((long)((long)local_200 + 8) + 7),"MENT",4);
    local_1f8 = (pointer)local_298._0_8_;
    *(char *)(local_298._0_8_ + (long)local_200) = '\0';
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "#extension GL_OES_texture_storage_multisample_2d_array : require\n";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x964c22);
  }
  else {
LAB_004f714d:
    local_298._0_8_ = (pointer)0x13;
    local_200 = (undefined1  [8])local_1f0;
    local_200 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_200,(ulong)local_298);
    local_1f0[0]._M_allocated_capacity._0_4_ = (undefined4)local_298._0_8_;
    local_1f0[0]._M_local_buf[4] = SUB81(local_298._0_8_,4);
    local_1f0[0]._M_allocated_capacity._5_2_ = SUB82(local_298._0_8_,5);
    local_1f0[0]._M_local_buf[7] = SUB81(local_298._0_8_,7);
    *(undefined8 *)local_200 = 0x4f49534e45545845;
    *(undefined8 *)((long)local_200 + 8) = 0x4d45544154535f4e;
    builtin_strncpy((char *)((long)((long)local_200 + 8) + 7),"MENT",4);
    local_1f8 = (pointer)local_298._0_8_;
    *(char *)(local_298._0_8_ + (long)local_200) = '\0';
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = SSBOArrayLengthTests::init::arraysSized + 1;
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x98644f);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,
                    CONCAT17(local_1f0[0]._M_local_buf[7],
                             CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1f0[0]._M_local_buf[4],
                                               (undefined4)local_1f0[0]._M_allocated_capacity))) + 1
                   );
  }
  switch(this->m_type) {
  case TEXTURE_COLOR_2D:
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x504d4153;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x5245;
    local_1f0[0]._M_local_buf[7] = 'T';
    local_1f0[0]._M_local_buf[8] = 'Y';
    local_1f0[0]._9_2_ = 0x4550;
    local_1f8 = (pointer)0xb;
    local_1f0[0]._M_local_buf[0xb] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "sampler2DMS";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9898c6);
    break;
  case TEXTURE_COLOR_2D_ARRAY:
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x504d4153;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x5245;
    local_1f0[0]._M_local_buf[7] = 'T';
    local_1f0[0]._M_local_buf[8] = 'Y';
    local_1f0[0]._9_2_ = 0x4550;
    local_1f8 = (pointer)0xb;
    local_1f0[0]._M_local_buf[0xb] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "sampler2DMSArray";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9898d3);
    break;
  case TEXTURE_INT_2D:
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x504d4153;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x5245;
    local_1f0[0]._M_local_buf[7] = 'T';
    local_1f0[0]._M_local_buf[8] = 'Y';
    local_1f0[0]._9_2_ = 0x4550;
    local_1f8 = (pointer)0xb;
    local_1f0[0]._M_local_buf[0xb] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "isampler2DMS";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9898c5);
    break;
  case TEXTURE_INT_2D_ARRAY:
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x504d4153;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x5245;
    local_1f0[0]._M_local_buf[7] = 'T';
    local_1f0[0]._M_local_buf[8] = 'Y';
    local_1f0[0]._9_2_ = 0x4550;
    local_1f8 = (pointer)0xb;
    local_1f0[0]._M_local_buf[0xb] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "isampler2DMSArray";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9898d2);
    break;
  case TEXTURE_UINT_2D:
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x504d4153;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x5245;
    local_1f0[0]._M_local_buf[7] = 'T';
    local_1f0[0]._M_local_buf[8] = 'Y';
    local_1f0[0]._9_2_ = 0x4550;
    local_1f8 = (pointer)0xb;
    local_1f0[0]._M_local_buf[0xb] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "usampler2DMS";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9898e4);
    break;
  case TEXTURE_UINT_2D_ARRAY:
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x504d4153;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x5245;
    local_1f0[0]._M_local_buf[7] = 'T';
    local_1f0[0]._M_local_buf[8] = 'Y';
    local_1f0[0]._9_2_ = 0x4550;
    local_1f8 = (pointer)0xb;
    local_1f0[0]._M_local_buf[0xb] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "usampler2DMSArray";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9898f1);
    break;
  case TEXTURE_DEPTH_2D:
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x504d4153;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x5245;
    local_1f0[0]._M_local_buf[7] = 'T';
    local_1f0[0]._M_local_buf[8] = 'Y';
    local_1f0[0]._9_2_ = 0x4550;
    local_1f8 = (pointer)0xb;
    local_1f0[0]._M_local_buf[0xb] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "sampler2DMS";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9898c6);
    break;
  case TEXTURE_DEPTH_2D_ARRAY:
    local_1f0[0]._M_allocated_capacity._0_4_ = 0x504d4153;
    local_1f0[0]._M_local_buf[4] = 'L';
    local_1f0[0]._M_allocated_capacity._5_2_ = 0x5245;
    local_1f0[0]._M_local_buf[7] = 'T';
    local_1f0[0]._M_local_buf[8] = 'Y';
    local_1f0[0]._9_2_ = 0x4550;
    local_1f8 = (pointer)0xb;
    local_1f0[0]._M_local_buf[0xb] = '\0';
    local_200 = (undefined1  [8])local_1f0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_2c8,(key_type *)local_200);
    pcVar23 = "sampler2DMSArray";
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9898d3);
    break;
  default:
    goto switchD_004f726a_default;
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,
                    CONCAT17(local_1f0[0]._M_local_buf[7],
                             CONCAT25(local_1f0[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1f0[0]._M_local_buf[4],
                                               (undefined4)local_1f0[0]._M_allocated_capacity))) + 1
                   );
  }
switchD_004f726a_default:
  local_270 = (ShaderProgram *)operator_new(0xd0);
  pCVar4 = (this->super_TestCase).m_context;
  pRVar5 = pCVar4->m_renderCtx;
  local_150[0x10] = 0;
  local_150._17_8_ = 0;
  local_150._0_8_ = (pointer)0x0;
  local_150[8] = 0;
  local_150._9_7_ = 0;
  memset(local_200,0,0xac);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_268,(_anonymous_namespace_ *)pCVar4,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp float v_gradient;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_gradient = a_position.x * 0.5 + 0.5;\n}\n"
             ,pcVar23);
  local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
  local_298._8_8_ = &local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_298 + 8),local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_200 + (local_298._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_298 + 8));
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_248.m_log = (TestLog *)0x29d;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_240,(ulong)&local_248);
  SVar6.m_log = local_248.m_log;
  local_240.field_2._M_allocated_capacity = (size_type)local_248.m_log;
  local_240._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "${GLSL_VERSION_DECL}\n${EXTENSION_STATEMENT}layout(location = 0) out highp vec4 fragColor;\nuniform highp ${SAMPLERTYPE} u_sampler;\nuniform highp int u_maxSamples;\nuniform highp int u_layer;\nuniform highp float u_cmpValue;\nin highp float v_gradient;\nvoid main (void)\n{\n\tconst highp vec4 okColor = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 failColor = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp float epsilon = ${EPSILON};\n\n\thighp int sampleNdx = clamp(int(floor(v_gradient * float(u_maxSamples))), 0, u_maxSamples-1);\n\thighp float value = float(texelFetch(u_sampler, ${FETCHPOS}, sampleNdx).r);\n\tfragColor = (abs(u_cmpValue - value) < epsilon) ? (okColor) : (failColor);\n}\n"
         ,0x29d);
  local_240._M_string_length = (size_type)SVar6.m_log;
  __dest[(long)SVar6.m_log] = '\0';
  tcu::StringTemplate::StringTemplate(&local_50,&local_240);
  tcu::StringTemplate::specialize
            (&local_220,&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2c8);
  local_80._0_4_ = 1;
  local_80._8_8_ = &local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_80 + 8),
             CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_),
             local_220._M_string_length +
             CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_));
  pSVar14 = local_270;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_200 + (ulong)(uint)local_80._0_4_ * 0x18),(value_type *)(local_80 + 8));
  glu::ShaderProgram::ShaderProgram(pSVar14,pRVar5,(ProgramSources *)local_200);
  this->m_samplerShader = pSVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_) !=
      &local_220.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_220._M_dataplus._M_p._4_4_,local_220._M_dataplus._M_p._0_4_),
                    local_220.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,(ulong)(local_240.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._8_8_ != &local_280) {
    operator_delete((void *)local_298._8_8_,local_280._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_150);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_170);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_200 + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_samplerShader);
  if ((this->m_samplerShader->m_program).m_info.linkOk == false) {
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    local_200 = (undefined1  [8])local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"could not build shader","")
    ;
    tcu::TestError::TestError(pTVar17,(string *)local_200);
    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2c8);
  tcu::TestLog::endSection(local_58.m_log);
  return extraout_EAX;
}

Assistant:

void MultisampleTextureUsageCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const glw::GLenum		internalFormat	= (m_isColorFormat) ? (GL_R8) : (m_isSignedFormat) ? (GL_R8I) : (m_isUnsignedFormat) ? (GL_R8UI) : (m_isDepthFormat) ? (GL_DEPTH_COMPONENT32F) : (0);
	const glw::GLenum		textureTarget	= (m_isArrayType) ? (GL_TEXTURE_2D_MULTISAMPLE_ARRAY) : (GL_TEXTURE_2D_MULTISAMPLE);
	const glw::GLenum		fboAttachment	= (m_isDepthFormat) ? (GL_DEPTH_ATTACHMENT) : (GL_COLOR_ATTACHMENT0);
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	DE_ASSERT(internalFormat);

	// requirements

	if (m_isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		throw tcu::NotSupportedError("Test requires OES_texture_storage_multisample_2d_array extension");
	if (m_context.getRenderTarget().getWidth() < s_textureSize || m_context.getRenderTarget().getHeight() < s_textureSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(static_cast<int>(s_textureSize)) + "x" + de::toString(static_cast<int>(s_textureSize)));

	{
		glw::GLint maxSamples = 0;
		gl.getInternalformativ(textureTarget, internalFormat, GL_SAMPLES, 1, &maxSamples);

		if (m_numSamples > maxSamples)
			throw tcu::NotSupportedError("Requested sample count is greater than supported");

		m_testCtx.getLog() << tcu::TestLog::Message << "Max sample count for " << glu::getTextureFormatStr(internalFormat) << ": " << maxSamples << tcu::TestLog::EndMessage;
	}

	{
		GLint maxTextureSize = 0;
		gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);

		if (s_textureSize > maxTextureSize)
			throw tcu::NotSupportedError("Larger GL_MAX_TEXTURE_SIZE is required");
	}

	if (m_isArrayType)
	{
		GLint maxTextureLayers = 0;
		gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &maxTextureLayers);

		if (s_textureArraySize > maxTextureLayers)
			throw tcu::NotSupportedError("Larger GL_MAX_ARRAY_TEXTURE_LAYERS is required");
	}

	// create texture

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample " << ((m_isDepthFormat) ? ("depth") : ("")) << " texture" << ((m_isArrayType) ? (" array") : ("")) << tcu::TestLog::EndMessage;

	gl.genTextures(1, &m_textureID);
	gl.bindTexture(textureTarget, m_textureID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind texture");

	if (m_isArrayType)
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, m_numSamples, internalFormat, s_textureSize, s_textureSize, s_textureArraySize, GL_FALSE);
	else
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, m_numSamples, internalFormat, s_textureSize, s_textureSize, GL_FALSE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texstorage");

	// create fbo for drawing

	gl.genFramebuffers(1, &m_fboID);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fboID);

	if (m_isArrayType)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Attaching multisample texture array layer " << static_cast<int>(s_textureLayer) << " to fbo" << tcu::TestLog::EndMessage;
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, fboAttachment, m_textureID, 0, s_textureLayer);
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Attaching multisample texture to fbo" << tcu::TestLog::EndMessage;
		gl.framebufferTexture2D(GL_FRAMEBUFFER, fboAttachment, textureTarget, m_textureID, 0);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

	// create shader for rendering to fbo
	genDrawShader();

	// create shader for sampling the texture rendered to
	genSamplerShader();
}